

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

StackSize * __thiscall
miniscript::Node<CPubKey>::CalcStackSize(StackSize *__return_storage_ptr__,Node<CPubKey> *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined8 uVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  int32_t iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  element_type *peVar12;
  size_t j;
  ulong uVar13;
  SatInfo *pSVar14;
  SatInfo *pSVar15;
  long in_FS_OFFSET;
  SatInfo SVar16;
  SatInfo SVar17;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> next_sats;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> sats;
  SatInfo local_e8;
  SatInfo local_d8;
  SatInfo local_c8;
  SatInfo local_b8;
  SatInfo local_a8;
  SatInfo local_98;
  SatInfo local_88;
  SatInfo local_78;
  SatInfo local_68;
  SatInfo local_58;
  SatInfo local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    (__return_storage_ptr__->sat).exec = 0;
    goto LAB_0034cadc;
  case JUST_1:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = 0;
      (__return_storage_ptr__->dsat).netdiff = 0;
      (__return_storage_ptr__->dsat).exec = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0034cf28;
  case PK_K:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    (__return_storage_ptr__->sat).exec = 0;
LAB_0034cadc:
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = -1;
    goto LAB_0034c69c;
  case PK_H:
    local_48 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_58 = (SatInfo)ZEXT812(1);
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = miniscript::internal::operator+(&local_48,&local_58);
    local_68 = (SatInfo)ZEXT812(0xffffffff00000001);
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_68);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    local_78.exec = 2;
    local_78.valid = true;
    local_78._1_3_ = 0;
    local_78.netdiff = 2;
    SVar16 = miniscript::internal::operator+((SatInfo *)&sats,&local_78);
    __return_storage_ptr__->sat = SVar16;
    goto LAB_0034cda2;
  case OLDER:
  case AFTER:
    pSVar15 = (SatInfo *)&sats;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0xffffffff00000001;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
    pSVar14 = (SatInfo *)&next_sats;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(1);
    goto LAB_0034c68b;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    local_68 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_78 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_58 = miniscript::internal::operator+(&local_68,&local_78);
    local_88.exec = 2;
    local_88.valid = true;
    local_88._1_3_ = 0;
    local_88.netdiff = 2;
    local_48 = miniscript::internal::operator+(&local_58,&local_88);
    local_98.valid = true;
    local_98._1_3_ = 0;
    local_98.netdiff = 0;
    local_98.exec = 0;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = miniscript::internal::operator+(&local_48,&local_98);
    local_a8.valid = true;
    local_a8._1_3_ = 0;
    local_a8.netdiff = -1;
    local_a8.exec = 0;
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_a8);
    pSVar15 = (SatInfo *)&sats;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    pSVar14 = &local_b8;
    goto LAB_0034c344;
  case WRAP_A:
  case WRAP_S:
  case WRAP_N:
    peVar2 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->dsat).netdiff =
           *(undefined8 *)((long)&peVar2->ss + 0x10);
      uVar6 = *(undefined8 *)&(peVar2->ss).sat;
      uVar4 = *(undefined8 *)((long)&peVar2->ss + 8);
      (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
      *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
      (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = uVar4;
      return __return_storage_ptr__;
    }
    goto LAB_0034cf28;
  case WRAP_C:
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    SVar16 = miniscript::internal::operator+
                       (&(((((this->subs).
                             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->ss).sat,(SatInfo *)&sats);
    iVar8 = SVar16.exec;
    uVar6 = SVar16._0_8_;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
    SVar16 = miniscript::internal::operator+
                       ((SatInfo *)
                        ((long)&((((this->subs).
                                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->ss + 0xc),(SatInfo *)&next_sats);
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
    goto LAB_0034c9af;
  case WRAP_D:
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(0xffffffff00000001);
    local_48.exec = 1;
    local_48.valid = true;
    local_48._1_3_ = 0;
    local_48.netdiff = 1;
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_48);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    SVar16 = miniscript::internal::operator+
                       ((SatInfo *)&sats,
                        &(((((this->subs).
                             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->ss).sat);
    pSVar15 = &local_58;
    local_58 = (SatInfo)ZEXT812(0xffffffff00000001);
    pSVar14 = &local_68;
    local_68.exec = 1;
    local_68.valid = true;
    local_68._1_3_ = 0;
    local_68.netdiff = 1;
    goto LAB_0034cc9a;
  case WRAP_V:
    pSVar15 = &(((((this->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ss).sat;
    pSVar14 = (SatInfo *)&sats;
LAB_0034c344:
    pSVar14->valid = true;
    *(undefined3 *)&pSVar14->field_0x1 = 0;
    pSVar14->netdiff = 1;
    pSVar14->exec = 1;
    goto LAB_0034c68b;
  case WRAP_J:
    local_48 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_58 = (SatInfo)ZEXT812(1);
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = miniscript::internal::operator+(&local_48,&local_58);
    local_68.exec = 1;
    local_68.valid = true;
    local_68._1_3_ = 0;
    local_68.netdiff = 1;
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_68);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    SVar16 = miniscript::internal::operator+
                       ((SatInfo *)&sats,
                        &(((((this->subs).
                             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->ss).sat);
    local_88 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_98.valid = true;
    local_98._1_3_ = 0;
    local_98.netdiff = 0;
    local_98.exec = 0;
    local_78 = miniscript::internal::operator+(&local_88,&local_98);
    pSVar15 = &local_78;
    pSVar14 = &local_a8;
    local_a8.valid = true;
    local_a8._1_3_ = 0;
    local_a8.netdiff = 1;
    local_a8.exec = 1;
LAB_0034cc9a:
    iVar8 = SVar16.exec;
    uVar6 = SVar16._0_8_;
    SVar16 = miniscript::internal::operator+(pSVar15,pSVar14);
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
LAB_0034cd9e:
    (__return_storage_ptr__->sat).exec = iVar8;
LAB_0034cda2:
    __return_storage_ptr__->dsat = SVar16;
    break;
  case AND_V:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar15 = &(((psVar1->
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ss).sat;
    pSVar14 = &((psVar1[1].
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->ss).sat;
LAB_0034c68b:
    SVar16 = miniscript::internal::operator+(pSVar15,pSVar14);
    __return_storage_ptr__->sat = SVar16;
    (__return_storage_ptr__->dsat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
LAB_0034c69c:
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case AND_B:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar3 = psVar1[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    SVar16 = miniscript::internal::operator+(&(peVar2->ss).sat,&(peVar3->ss).sat);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
    SVar16 = miniscript::internal::operator+((SatInfo *)&sats,(SatInfo *)&next_sats);
    iVar8 = SVar16.exec;
    uVar6 = SVar16._0_8_;
    local_48 = miniscript::internal::operator+
                         ((SatInfo *)((long)&peVar2->ss + 0xc),(SatInfo *)((long)&peVar3->ss + 0xc))
    ;
    local_58.exec = 1;
    local_58.valid = true;
    local_58._1_3_ = 0;
    local_58.netdiff = 1;
    SVar16 = miniscript::internal::operator+(&local_48,&local_58);
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
    goto LAB_0034cd9e;
  case OR_B:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar3 = psVar1[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pSVar15 = (SatInfo *)((long)&peVar3->ss + 0xc);
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         miniscript::internal::operator+(&(peVar2->ss).sat,pSVar15);
    pSVar14 = (SatInfo *)((long)&peVar2->ss + 0xc);
    local_48 = miniscript::internal::operator+(pSVar14,&(peVar3->ss).sat);
    SVar16 = miniscript::internal::operator|((SatInfo *)&next_sats,&local_48);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    local_58.exec = 1;
    local_58.valid = true;
    local_58._1_3_ = 0;
    local_58.netdiff = 1;
    SVar17 = miniscript::internal::operator+((SatInfo *)&sats,&local_58);
    local_68 = miniscript::internal::operator+(pSVar14,pSVar15);
    pSVar15 = &local_68;
    pSVar14 = &local_78;
    local_78.exec = 1;
    local_78.valid = true;
    local_78._1_3_ = 0;
    local_78.netdiff = 1;
    goto LAB_0034cd8e;
  case OR_C:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar3 = psVar1[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
    SVar16 = miniscript::internal::operator+(&(peVar2->ss).sat,(SatInfo *)&next_sats);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    local_68.exec = 1;
    local_68.valid = true;
    local_68._1_3_ = 0;
    local_68.netdiff = 1;
    local_58 = miniscript::internal::operator+((SatInfo *)((long)&peVar2->ss + 0xc),&local_68);
    local_48 = miniscript::internal::operator+(&local_58,&(peVar3->ss).sat);
    SVar16 = miniscript::internal::operator|((SatInfo *)&sats,&local_48);
    __return_storage_ptr__->sat = SVar16;
    (__return_storage_ptr__->dsat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case OR_D:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar12 = psVar1[1].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_48 = (SatInfo)ZEXT812(0xffffffff00000001);
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         miniscript::internal::operator+(&(peVar2->ss).sat,&local_48);
    local_58.exec = 1;
    local_58.valid = true;
    local_58._1_3_ = 0;
    local_58.netdiff = 1;
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_58);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    pSVar15 = (SatInfo *)((long)&peVar2->ss + 0xc);
    local_98.valid = true;
    local_98._1_3_ = 0;
    local_98.netdiff = 0;
    local_98.exec = 0;
    local_88 = miniscript::internal::operator+(pSVar15,&local_98);
    local_a8.valid = true;
    local_a8._1_3_ = 0;
    local_a8.netdiff = 1;
    local_a8.exec = 1;
    local_78 = miniscript::internal::operator+(&local_88,&local_a8);
    local_68 = miniscript::internal::operator+(&local_78,&(peVar12->ss).sat);
    SVar17 = miniscript::internal::operator|((SatInfo *)&sats,&local_68);
    local_d8.valid = true;
    local_d8._1_3_ = 0;
    local_d8.netdiff = 0;
    local_d8.exec = 0;
    local_c8 = miniscript::internal::operator+(pSVar15,&local_d8);
    local_e8.valid = true;
    local_e8._1_3_ = 0;
    local_e8.netdiff = 1;
    local_e8.exec = 1;
    SVar16 = miniscript::internal::operator+(&local_c8,&local_e8);
    pSVar15 = &local_b8;
    goto LAB_0034cd81;
  case OR_I:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar3 = psVar1[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000001;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         miniscript::internal::operator|(&(peVar2->ss).sat,&(peVar3->ss).sat);
    SVar16 = miniscript::internal::operator+((SatInfo *)&sats,(SatInfo *)&next_sats);
    iVar8 = SVar16.exec;
    uVar6 = SVar16._0_8_;
    local_48.exec = 1;
    local_48.valid = true;
    local_48._1_3_ = 0;
    local_48.netdiff = 1;
    local_58 = miniscript::internal::operator|
                         ((SatInfo *)((long)&peVar2->ss + 0xc),(SatInfo *)((long)&peVar3->ss + 0xc))
    ;
    SVar16 = miniscript::internal::operator+(&local_48,&local_58);
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
LAB_0034c9af:
    (__return_storage_ptr__->sat).exec = iVar8;
    __return_storage_ptr__->dsat = SVar16;
    break;
  case ANDOR:
    psVar1 = (this->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar2 = (psVar1->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar3 = psVar1[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar12 = psVar1[2].
              super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_48.exec = 1;
    local_48.valid = true;
    local_48._1_3_ = 0;
    local_48.netdiff = 1;
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         miniscript::internal::operator+(&(peVar2->ss).sat,&local_48);
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&(peVar3->ss).sat);
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = SVar16._0_8_;
    sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SVar16.exec;
    pSVar15 = (SatInfo *)((long)&peVar2->ss + 0xc);
    local_78.exec = 1;
    local_78.valid = true;
    local_78._1_3_ = 0;
    local_78.netdiff = 1;
    local_68 = miniscript::internal::operator+(pSVar15,&local_78);
    local_58 = miniscript::internal::operator+(&local_68,&(peVar12->ss).sat);
    SVar17 = miniscript::internal::operator|((SatInfo *)&sats,&local_58);
    local_98.valid = true;
    local_98._1_3_ = 0;
    local_98.netdiff = 1;
    local_98.exec = 1;
    SVar16 = miniscript::internal::operator+(pSVar15,&local_98);
    pSVar15 = &local_88;
LAB_0034cd81:
    *pSVar15 = SVar16;
    pSVar14 = (SatInfo *)((long)&peVar12->ss + 0xc);
LAB_0034cd8e:
    iVar8 = SVar17.exec;
    uVar6 = SVar17._0_8_;
    SVar16 = miniscript::internal::operator+(pSVar15,pSVar14);
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar6;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar6 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar6 >> 0x20);
    goto LAB_0034cd9e;
  case THRESH:
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ = ZEXT812(1);
    Vector<miniscript::internal::SatInfo>(&sats,(SatInfo *)&next_sats);
    uVar11 = 0;
    while( true ) {
      uVar13 = 1;
      psVar1 = (this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->subs).
                        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar11)
      break;
      uVar9 = uVar13;
      if (uVar11 != 0) {
        uVar9 = 0x100000001;
      }
      local_48.exec._0_1_ = uVar11 != 0;
      local_48.valid = (bool)(char)uVar9;
      local_48._1_3_ = (int3)(uVar9 >> 8);
      local_48.netdiff = (int)(uVar9 >> 0x20);
      local_48.exec._1_3_ = 0;
      local_68 = miniscript::internal::operator+
                           (sats.
                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (SatInfo *)
                            ((long)&(psVar1[uVar11].
                                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->ss + 0xc));
      local_58 = miniscript::internal::operator+(&local_68,&local_48);
      Vector<miniscript::internal::SatInfo>(&next_sats,&local_58);
      lVar7 = 0;
      for (; lVar10 = CONCAT44(sats.
                               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               (int32_t)sats.
                                        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish) -
                      (long)sats.
                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start,
          uVar13 < (ulong)(lVar10 / 0xc); uVar13 = uVar13 + 1) {
        local_78 = miniscript::internal::operator+
                             ((SatInfo *)
                              (&sats.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].valid + lVar7),
                              (SatInfo *)
                              ((long)&((this->subs).
                                       super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                       super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->ss + 0xc));
        local_88 = miniscript::internal::operator+
                             ((SatInfo *)
                              (&(sats.
                                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->valid + lVar7),
                              &(((this->subs).
                                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar11].
                                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->ss).sat);
        local_68 = miniscript::internal::operator|(&local_78,&local_88);
        local_58 = miniscript::internal::operator+(&local_68,&local_48);
        std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
        emplace_back<miniscript::internal::SatInfo>(&next_sats,&local_58);
        lVar7 = lVar7 + 0xc;
      }
      local_68 = miniscript::internal::operator+
                           ((SatInfo *)
                            ((long)sats.
                                   super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar10 + -0xc),
                            &(((this->subs).
                               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar11].
                               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->ss).sat);
      local_58 = miniscript::internal::operator+(&local_68,&local_48);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      emplace_back<miniscript::internal::SatInfo>(&next_sats,&local_58);
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      _M_move_assign(&sats,(SatInfo *)&next_sats);
      std::
      _Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      ~_Vector_base((_Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     *)&next_sats);
      uVar11 = uVar11 + 1;
    }
    local_48 = (SatInfo)ZEXT812(0xffffffff00000001);
    next_sats.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._0_12_ =
         miniscript::internal::operator+
                   (sats.
                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->k,&local_48);
    local_58.exec = 1;
    local_58.valid = true;
    local_58._1_3_ = 0;
    local_58.netdiff = 1;
    SVar16 = miniscript::internal::operator+((SatInfo *)&next_sats,&local_58);
    local_78 = (SatInfo)ZEXT812(0xffffffff00000001);
    local_68 = miniscript::internal::operator+
                         (sats.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,&local_78);
    local_88.exec = 1;
    local_88.valid = true;
    local_88._1_3_ = 0;
    local_88.netdiff = 1;
    SVar17 = miniscript::internal::operator+(&local_68,&local_88);
    __return_storage_ptr__->sat = SVar16;
    __return_storage_ptr__->dsat = SVar17;
    std::_Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ::~_Vector_base(&sats.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                   );
    break;
  case MULTI:
    iVar5 = (int)(((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x41) + this->k + 2;
    lVar7 = ((ulong)this->k << 0x20) + 1;
    *(long *)&__return_storage_ptr__->sat = lVar7;
    (__return_storage_ptr__->sat).exec = iVar5;
    *(long *)&__return_storage_ptr__->dsat = lVar7;
    (__return_storage_ptr__->dsat).exec = iVar5;
    break;
  case MULTI_A:
    lVar7 = ((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x41;
    lVar10 = (lVar7 << 0x20) + -0xffffffff;
    *(long *)&__return_storage_ptr__->sat = lVar10;
    iVar8 = (int32_t)lVar7;
    (__return_storage_ptr__->sat).exec = iVar8;
    *(long *)&__return_storage_ptr__->dsat = lVar10;
    (__return_storage_ptr__->dsat).exec = iVar8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x452,
                  "internal::StackSize miniscript::Node<CPubKey>::CalcStackSize() const [Key = CPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0034cf28:
  __stack_chk_fail();
}

Assistant:

internal::StackSize CalcStackSize() const {
        using namespace internal;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, SatInfo::Push()};
            case Fragment::JUST_1: return {SatInfo::Push(), {}};
            case Fragment::OLDER:
            case Fragment::AFTER: return {SatInfo::Push() + SatInfo::Nop(), {}};
            case Fragment::PK_K: return {SatInfo::Push()};
            case Fragment::PK_H: return {SatInfo::OP_DUP() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY()};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {
                SatInfo::OP_SIZE() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUAL(),
                {}
            };
            case Fragment::ANDOR: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                const auto& z{subs[2]->ss};
                return {
                    (x.sat + SatInfo::If() + y.sat) | (x.dsat + SatInfo::If() + z.sat),
                    x.dsat + SatInfo::If() + z.dsat
                };
            }
            case Fragment::AND_V: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat, {}};
            }
            case Fragment::AND_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat + SatInfo::BinaryOp(), x.dsat + y.dsat + SatInfo::BinaryOp()};
            }
            case Fragment::OR_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    ((x.sat + y.dsat) | (x.dsat + y.sat)) + SatInfo::BinaryOp(),
                    x.dsat + y.dsat + SatInfo::BinaryOp()
                };
            }
            case Fragment::OR_C: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {(x.sat + SatInfo::If()) | (x.dsat + SatInfo::If() + y.sat), {}};
            }
            case Fragment::OR_D: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    (x.sat + SatInfo::OP_IFDUP(true) + SatInfo::If()) | (x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.sat),
                    x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.dsat
                };
            }
            case Fragment::OR_I: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {SatInfo::If() + (x.sat | y.sat), SatInfo::If() + (x.dsat | y.dsat)};
            }
            // multi(k, key1, key2, ..., key_n) starts off with k+1 stack elements (a 0, plus k
            // signatures), then reaches n+k+3 stack elements after pushing the n keys, plus k and
            // n itself, and ends with 1 stack element (success or failure). Thus, it net removes
            // k elements (from k+1 to 1), while reaching k+n+2 more than it ends with.
            case Fragment::MULTI: return {SatInfo(k, k + keys.size() + 2)};
            // multi_a(k, key1, key2, ..., key_n) starts off with n stack elements (the
            // signatures), reaches 1 more (after the first key push), and ends with 1. Thus it net
            // removes n-1 elements (from n to 1) while reaching n more than it ends with.
            case Fragment::MULTI_A: return {SatInfo(keys.size() - 1, keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S: return subs[0]->ss;
            case Fragment::WRAP_C: return {
                subs[0]->ss.sat + SatInfo::OP_CHECKSIG(),
                subs[0]->ss.dsat + SatInfo::OP_CHECKSIG()
            };
            case Fragment::WRAP_D: return {
                SatInfo::OP_DUP() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_DUP() + SatInfo::If()
            };
            case Fragment::WRAP_V: return {subs[0]->ss.sat + SatInfo::OP_VERIFY(), {}};
            case Fragment::WRAP_J: return {
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If()
            };
            case Fragment::THRESH: {
                // sats[j] is the SatInfo corresponding to all traces reaching j satisfactions.
                auto sats = Vector(SatInfo::Empty());
                for (size_t i = 0; i < subs.size(); ++i) {
                    // Loop over the subexpressions, processing them one by one. After adding
                    // element i we need to add OP_ADD (if i>0).
                    auto add = i ? SatInfo::BinaryOp() : SatInfo::Empty();
                    // Construct a variable that will become the next sats, starting with index 0.
                    auto next_sats = Vector(sats[0] + subs[i]->ss.dsat + add);
                    // Then loop to construct next_sats[1..i].
                    for (size_t j = 1; j < sats.size(); ++j) {
                        next_sats.push_back(((sats[j] + subs[i]->ss.dsat) | (sats[j - 1] + subs[i]->ss.sat)) + add);
                    }
                    // Finally construct next_sats[i+1].
                    next_sats.push_back(sats[sats.size() - 1] + subs[i]->ss.sat + add);
                    // Switch over.
                    sats = std::move(next_sats);
                }
                // To satisfy thresh we need k satisfactions; to dissatisfy we need 0. In both
                // cases a push of k and an OP_EQUAL follow.
                return {
                    sats[k] + SatInfo::Push() + SatInfo::OP_EQUAL(),
                    sats[0] + SatInfo::Push() + SatInfo::OP_EQUAL()
                };
            }
        }
        assert(false);
    }